

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O1

vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> * __thiscall
happly::PLYData::getVertexPositions
          (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
           *__return_storage_ptr__,PLYData *this,string *vertexElementName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer paVar2;
  Element *pEVar3;
  unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *puVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  vector<double,_std::allocator<double>_> xPos;
  vector<double,_std::allocator<double>_> zPos;
  vector<double,_std::allocator<double>_> yPos;
  string local_90;
  vector<double,_std::allocator<double>_> local_70;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  
  pEVar3 = getElement(this,vertexElementName);
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"x","");
  puVar4 = Element::getPropertyPtr(pEVar3,&local_90);
  Element::getDataFromPropertyRecursive<double,double>
            (&local_70,pEVar3,
             (puVar4->_M_t).
             super___uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_>._M_t.
             super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>.
             super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pEVar3 = getElement(this,vertexElementName);
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"y","");
  puVar4 = Element::getPropertyPtr(pEVar3,&local_90);
  Element::getDataFromPropertyRecursive<double,double>
            (&local_40,pEVar3,
             (puVar4->_M_t).
             super___uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_>._M_t.
             super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>.
             super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pEVar3 = getElement(this,vertexElementName);
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"z","");
  puVar4 = Element::getPropertyPtr(pEVar3,&local_90);
  Element::getDataFromPropertyRecursive<double,double>
            (&local_58,pEVar3,
             (puVar4->_M_t).
             super___uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_>._M_t.
             super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>.
             super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  geometrycentral::surface::std::
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            (__return_storage_ptr__,
             (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_90);
  paVar2 = (__return_storage_ptr__->
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(__return_storage_ptr__->
                super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)paVar2;
  if (lVar6 != 0) {
    lVar6 = (lVar6 >> 3) * -0x5555555555555555;
    pdVar5 = paVar2->_M_elems + 2;
    lVar7 = 0;
    do {
      ((array<double,_3UL> *)(pdVar5 + -2))->_M_elems[0] =
           local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7];
      pdVar5[-1] = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7];
      *pdVar5 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
      lVar7 = lVar7 + 1;
      pdVar5 = pdVar5 + 3;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::array<double, 3>> getVertexPositions(const std::string& vertexElementName = "vertex") {

    std::vector<double> xPos = getElement(vertexElementName).getProperty<double>("x");
    std::vector<double> yPos = getElement(vertexElementName).getProperty<double>("y");
    std::vector<double> zPos = getElement(vertexElementName).getProperty<double>("z");

    std::vector<std::array<double, 3>> result(xPos.size());
    for (size_t i = 0; i < result.size(); i++) {
      result[i][0] = xPos[i];
      result[i][1] = yPos[i];
      result[i][2] = zPos[i];
    }

    return result;
  }